

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void __thiscall RtApiAlsa::closeStream(RtApiAlsa *this)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  int local_20;
  bool local_19;
  int i;
  bool pcm_closed;
  AlsaHandle *apiInfo;
  RtApiAlsa *this_local;
  
  if ((this->super_RtApi).stream_.state == STREAM_CLOSED) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_RtApi).errorText_,
               "RtApiAlsa::closeStream(): no open stream to close!");
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
  }
  else {
    plVar1 = (long *)(this->super_RtApi).stream_.apiHandle;
    (this->super_RtApi).stream_.callbackInfo.isRunning = false;
    pthread_mutex_lock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
    if ((this->super_RtApi).stream_.state == STREAM_STOPPED) {
      *(undefined1 *)(plVar1 + 9) = 1;
      pthread_cond_signal((pthread_cond_t *)(plVar1 + 3));
    }
    pthread_mutex_unlock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
    pthread_join((this->super_RtApi).stream_.callbackInfo.thread,(void **)0x0);
    if ((this->super_RtApi).stream_.state == STREAM_RUNNING) {
      (this->super_RtApi).stream_.state = STREAM_STOPPED;
      if (((this->super_RtApi).stream_.mode == OUTPUT) ||
         ((this->super_RtApi).stream_.mode == DUPLEX)) {
        snd_pcm_drop(*plVar1);
      }
      if (((this->super_RtApi).stream_.mode == INPUT) ||
         ((this->super_RtApi).stream_.mode == DUPLEX)) {
        snd_pcm_drop(plVar1[1]);
      }
    }
    if (plVar1 != (long *)0x0) {
      pthread_cond_destroy((pthread_cond_t *)(plVar1 + 3));
      lVar2 = *plVar1;
      if (lVar2 != 0) {
        snd_pcm_close(*plVar1);
      }
      lVar3 = plVar1[1];
      if (lVar3 != 0) {
        snd_pcm_close(plVar1[1]);
      }
      local_19 = lVar3 != 0 || lVar2 != 0;
      if (local_19) {
        snd_config_update_free_global();
      }
      if (plVar1 != (long *)0x0) {
        operator_delete(plVar1);
      }
      (this->super_RtApi).stream_.apiHandle = (void *)0x0;
    }
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      if ((this->super_RtApi).stream_.userBuffer[local_20] != (char *)0x0) {
        free((this->super_RtApi).stream_.userBuffer[local_20]);
        (this->super_RtApi).stream_.userBuffer[local_20] = (char *)0x0;
      }
    }
    if ((this->super_RtApi).stream_.deviceBuffer != (char *)0x0) {
      free((this->super_RtApi).stream_.deviceBuffer);
      (this->super_RtApi).stream_.deviceBuffer = (char *)0x0;
    }
    RtApi::clearStreamInfo(&this->super_RtApi);
  }
  return;
}

Assistant:

void RtApiAlsa :: closeStream()
{
  if ( stream_.state == STREAM_CLOSED ) {
    errorText_ = "RtApiAlsa::closeStream(): no open stream to close!";
    error( RTAUDIO_WARNING );
    return;
  }

  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  stream_.callbackInfo.isRunning = false;
  MUTEX_LOCK( &stream_.mutex );
  if ( stream_.state == STREAM_STOPPED ) {
    apiInfo->runnable = true;
    pthread_cond_signal( &apiInfo->runnable_cv );
  }
  MUTEX_UNLOCK( &stream_.mutex );
  pthread_join( stream_.callbackInfo.thread, NULL );

  if ( stream_.state == STREAM_RUNNING ) {
    stream_.state = STREAM_STOPPED;
    if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX )
      snd_pcm_drop( apiInfo->handles[0] );
    if ( stream_.mode == INPUT || stream_.mode == DUPLEX )
      snd_pcm_drop( apiInfo->handles[1] );
  }

  if ( apiInfo ) {
    pthread_cond_destroy( &apiInfo->runnable_cv );
    bool pcm_closed = false;
    if ( apiInfo->handles[0] ){
      snd_pcm_close( apiInfo->handles[0] );
      pcm_closed = true;
    }
    if ( apiInfo->handles[1] ){
      snd_pcm_close( apiInfo->handles[1] );
      pcm_closed = true;
    }
    if ( pcm_closed ) {
      snd_config_update_free_global();
    }
    delete apiInfo;
    stream_.apiHandle = 0;
  }

  for ( int i=0; i<2; i++ ) {
    if ( stream_.userBuffer[i] ) {
      free( stream_.userBuffer[i] );
      stream_.userBuffer[i] = 0;
    }
  }

  if ( stream_.deviceBuffer ) {
    free( stream_.deviceBuffer );
    stream_.deviceBuffer = 0;
  }

  clearStreamInfo();
}